

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_do_more(connectdata *conn,int *complete)

{
  CURLcode local_1c;
  CURLcode result;
  int *complete_local;
  connectdata *conn_local;
  
  local_1c = CURLE_OK;
  *complete = 0;
  if (conn->handler->do_more != (Curl_do_more_func)0x0) {
    local_1c = (*conn->handler->do_more)(conn,complete);
  }
  if ((local_1c == CURLE_OK) && (*complete == 1)) {
    do_complete(conn);
  }
  return local_1c;
}

Assistant:

CURLcode Curl_do_more(struct connectdata *conn, int *complete)
{
  CURLcode result=CURLE_OK;

  *complete = 0;

  if(conn->handler->do_more)
    result = conn->handler->do_more(conn, complete);

  if(!result && (*complete == 1))
    /* do_complete must be called after the protocol-specific DO function */
    do_complete(conn);

  return result;
}